

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib517.c
# Opt level: O0

int test(char *URL)

{
  long lVar1;
  time_t out;
  int error;
  int i;
  char *URL_local;
  
  out._0_4_ = 0;
  out._4_4_ = 0;
  while (dates[out._4_4_].input != (char *)0x0) {
    lVar1 = curl_getdate(dates[out._4_4_].input,0);
    if (lVar1 != dates[out._4_4_].output) {
      curl_mprintf("WRONGLY %s => %ld (instead of %ld)\n",dates[out._4_4_].input,lVar1,
                   dates[out._4_4_].output);
      out._0_4_ = (int)out + 1;
    }
    out._4_4_ = out._4_4_ + 1;
  }
  return (int)out;
}

Assistant:

int test(char *URL)
{
  int i;
  int error = 0;

  (void)URL; /* not used */

  for(i = 0; dates[i].input; i++) {
    time_t out = curl_getdate(dates[i].input, NULL);
    if(out != dates[i].output) {
      printf("WRONGLY %s => %ld (instead of %ld)\n",
             dates[i].input, out, dates[i].output);
      error++;
    }
  }

  return error;
}